

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.hpp
# Opt level: O2

iterator __thiscall
nestl::impl::detail::
rb_tree<void_*,_void_*,_nestl::impl::detail::identity<void_*>,_std::less<void_*>,_nestl::allocator<void_*>_>
::erase(rb_tree<void_*,_void_*,_nestl::impl::detail::identity<void_*>,_std::less<void_*>,_nestl::allocator<void_*>_>
        *this,const_iterator position)

{
  rb_tree_node_base *prVar1;
  
  prVar1 = rb_tree_increment<nestl::impl::detail::rb_tree_node_base_const*>(position.m_node);
  m_erase_aux(this,position);
  return (iterator)prVar1;
}

Assistant:

iterator
    erase(const_iterator position) NESTL_NOEXCEPT_SPEC
    {
        const_iterator result = position;
        ++result;
        m_erase_aux(position);
        return result.m_const_cast();
    }